

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

bool operator!=(Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
                *lhs,Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
                     *rhs)

{
  bool bVar1;
  
  bVar1 = operator==(lhs,rhs);
  return !bVar1;
}

Assistant:

bool operator!=(const Well& lhs, const Well& rhs)
    {
        return !(lhs == rhs);
    }